

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BottomLevelASVkImpl::BottomLevelASVkImpl
          (BottomLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,BottomLevelASDesc *Desc,RESOURCE_STATE InitialState,
          VkAccelerationStructureKHR vkBLAS)

{
  VulkanLogicalDevice *this_00;
  VkAccelerationStructureKHR_T *AS;
  VkDeviceAddress VVar1;
  VkAccelerationStructureKHR vkBLAS_local;
  RESOURCE_STATE InitialState_local;
  BottomLevelASDesc *Desc_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  IReferenceCounters *pRefCounters_local;
  BottomLevelASVkImpl *this_local;
  
  BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,Desc,false);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  .super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_010cdeb8;
  this->m_DeviceAddress = 0;
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  VulkanObjectWrapper(&this->m_VulkanBLAS,vkBLAS);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  VulkanObjectWrapper(&this->m_VulkanBuffer);
  VulkanUtilities::VulkanMemoryAllocation::VulkanMemoryAllocation(&this->m_MemoryAllocation);
  this->m_MemoryAlignedOffset = 0;
  BottomLevelASBase<Diligent::EngineVkImplTraits>::SetState
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,InitialState);
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pRenderDeviceVk);
  AS = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkAccelerationStructureKHR_T_
                 ((VulkanObjectWrapper *)&this->m_VulkanBLAS);
  VVar1 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress(this_00,AS);
  this->m_DeviceAddress = VVar1;
  return;
}

Assistant:

BottomLevelASVkImpl::BottomLevelASVkImpl(IReferenceCounters*        pRefCounters,
                                         RenderDeviceVkImpl*        pRenderDeviceVk,
                                         const BottomLevelASDesc&   Desc,
                                         RESOURCE_STATE             InitialState,
                                         VkAccelerationStructureKHR vkBLAS) :
    TBottomLevelASBase{pRefCounters, pRenderDeviceVk, Desc},
    m_VulkanBLAS{vkBLAS}
{
    SetState(InitialState);
    m_DeviceAddress = pRenderDeviceVk->GetLogicalDevice().GetAccelerationStructureDeviceAddress(m_VulkanBLAS);
}